

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

void CECoordinates::Galactic2CIRS
               (double glon,double glat,double *ra,double *dec,CEDate *date,CEAngleType *angle_type)

{
  int *in_RCX;
  double *in_RSI;
  double *in_RDI;
  double tmp_dec;
  double tmp_ra;
  CEAngleType *in_stack_00000078;
  CEDate *in_stack_00000080;
  double *in_stack_00000088;
  double *in_stack_00000090;
  double in_stack_00000098;
  double in_stack_000000a0;
  double *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  double in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  
  Galactic2ICRS(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                (double *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffa8,(CEAngleType *)0x12c95e);
  ICRS2CIRS(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
            in_stack_00000080,in_stack_00000078);
  if (*in_RCX == 0) {
    *in_RDI = *in_RDI * 57.29577951308232;
    *in_RSI = *in_RSI * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::Galactic2CIRS(double glon, double glat, double *ra, double *dec,
                                  const CEDate& date, const CEAngleType& angle_type)
{
    // Check for degrees
    if (angle_type == CEAngleType::DEGREES) {
        glon *= DD2R ;
        glat *= DD2R ;
    }
    
    // Do the Galactic -> ICRS converstion
    Galactic2ICRS(glon, glat, ra, dec, CEAngleType::RADIANS) ;
    
    // Now convert ICRS -> CIRS
    double tmp_ra(*ra);
    double tmp_dec(*dec);
    ICRS2CIRS(tmp_ra, tmp_dec, ra, dec, date, CEAngleType::RADIANS) ;
    
    // Now make sure to return the coordinates in the correct format
    if (angle_type == CEAngleType::DEGREES) {
        *ra  *= DR2D ;
        *dec *= DR2D ;
    }
}